

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

void ptls_base64_cell(uint8_t *data,char *text)

{
  int i;
  int n [4];
  char *text_local;
  uint8_t *data_local;
  
  n[0] = (int)(uint)*data >> 2;
  n[1] = (*data & 3) << 4 | (int)(uint)data[1] >> 4;
  n[2] = (data[1] & 0xf) << 2 | (int)(uint)data[2] >> 6;
  n[3] = data[2] & 0x3f;
  for (i = 0; i < 4; i = i + 1) {
    text[i] = ptls_base64_alphabet[n[i]];
  }
  return;
}

Assistant:

static void ptls_base64_cell(const uint8_t *data, char *text)
{
    int n[4];

    n[0] = data[0] >> 2;
    n[1] = ((data[0] & 3) << 4) | (data[1] >> 4);
    n[2] = ((data[1] & 15) << 2) | (data[2] >> 6);
    n[3] = data[2] & 63;

    for (int i = 0; i < 4; i++) {
        text[i] = ptls_base64_alphabet[n[i]];
    }
}